

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posixcrashhandler.cpp
# Opt level: O3

void __thiscall
Debug::PosixCrashHandler::walkStackTrace
          (PosixCrashHandler *this,char *memory,size_t memorySize,int maxFrames)

{
  long lVar1;
  long lVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  FILE *__stream;
  void *__ptr;
  char *pcVar6;
  undefined8 uVar7;
  ulong uVar8;
  char *allocated;
  long lVar9;
  size_t __n;
  char *local_48;
  uint local_3c;
  size_t local_38;
  
  lVar9 = (long)maxFrames;
  memory[lVar9 * 8] = '\0';
  local_38 = memorySize;
  uVar3 = ::backtrace(memory,maxFrames);
  lVar1 = *(long *)(memory + 0x10);
  lVar2 = *(long *)(memory + 8);
  if ((this->m_backtraceFilePath)._M_string_length != 0) {
    __stream = fopen((this->m_backtraceFilePath)._M_dataplus._M_p,"a");
    if (__stream != (FILE *)0x0) {
      fseek(__stream,0,2);
      iVar4 = fileno(__stream);
      backtrace_symbols_fd(memory,uVar3,iVar4);
      fclose(__stream);
    }
  }
  __ptr = (void *)backtrace_symbols(memory);
  if (__ptr != (void *)0x0) {
    uVar5 = (lVar1 == lVar2) + 1;
    local_3c = maxFrames;
    if ((int)uVar5 < (int)uVar3) {
      __n = ~(lVar9 << 3) + local_38;
      uVar8 = (ulong)uVar5;
      do {
        memset(memory + lVar9 * 8 + 1,0,__n);
        pcVar6 = dlDemangle(this,*(void **)(memory + uVar8 * 8),*(char **)((long)__ptr + uVar8 * 8),
                            (int)uVar8,memory + lVar9 * 8 + 1);
        if (pcVar6 != (char *)0x0) {
          local_48 = pcVar6;
          if ((this->m_backtraceCallback).super__Function_base._M_manager == (_Manager_type)0x0) {
            std::__throw_bad_function_call();
            goto LAB_0010ec96;
          }
          (*(this->m_backtraceCallback)._M_invoker)
                    ((_Any_data *)&this->m_backtraceCallback,&local_48);
        }
        uVar8 = uVar8 + 1;
      } while (uVar3 != uVar8);
    }
    if (uVar3 == local_3c) {
      local_48 = "[truncated]\n";
      if ((this->m_backtraceCallback).super__Function_base._M_manager == (_Manager_type)0x0) {
LAB_0010ec96:
        uVar7 = std::__throw_bad_function_call();
        free(__ptr);
        _Unwind_Resume(uVar7);
      }
      (*(this->m_backtraceCallback)._M_invoker)((_Any_data *)&this->m_backtraceCallback,&local_48);
    }
    free(__ptr);
  }
  return;
}

Assistant:

void PosixCrashHandler::walkStackTrace(char *memory, size_t memorySize, int maxFrames) {
        const size_t framesSize = maxFrames * sizeof(void*);
        void **callstack = reinterpret_cast<void**>(fake_alloc(&memory, framesSize));
        int frames = ::backtrace(callstack, maxFrames);

        const int stackOffset = callstack[2] == callstack[1] ? 2 : 1;

        if (!m_backtraceFilePath.empty()) {
            if (FILE *fp = fopen(m_backtraceFilePath.c_str(), "a")) {
                fseek(fp, 0, SEEK_END);
                int fd = fileno(fp);
                backtrace_symbols_fd(callstack, frames, fd);
                fclose(fp);
            }
        }

        std::unique_ptr<char*, FreeDeleter> symbolsPtr(backtrace_symbols(callstack, frames));
        if (!symbolsPtr) { return; }

        char **symbols = symbolsPtr.get();

        for (int i = stackOffset; i < frames; ++i) {
            memset(memory, 0, memorySize - framesSize - 1);

            char *stackFrame = dlDemangle(callstack[i], symbols[i], i, memory);
            if (stackFrame) {
                m_backtraceCallback(stackFrame);
            }
        }

        if (frames == maxFrames) {
            m_backtraceCallback("[truncated]\n");
        }
    }